

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

BranchInstr * __thiscall
Lowerer::InsertMissingItemCompareBranch
          (Lowerer *this,Opnd *compareSrc,OpCode opcode,LabelInstr *target,Instr *insertBeforeInstr)

{
  IRType IVar1;
  code *pcVar2;
  bool bVar3;
  Opnd *compareSrc1;
  undefined4 *puVar4;
  BranchInstr *pBVar5;
  char *this_00;
  
  this_00 = (char *)(ulong)compareSrc->m_type;
  compareSrc1 = GetMissingItemOpndForCompare(compareSrc->m_type,this->m_func);
  IVar1 = compareSrc->m_type;
  if ((IVar1 != TyInt32) && (IVar1 != TyVar)) {
    if (IVar1 == TyFloat64) {
      bVar3 = IR::Opnd::IsRegOpnd(compareSrc);
      if (!bVar3) {
        bVar3 = IR::Opnd::IsIndirOpnd(compareSrc);
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar4 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x465c,"(compareSrc->IsRegOpnd() || compareSrc->IsIndirOpnd())",
                             "compareSrc->IsRegOpnd() || compareSrc->IsIndirOpnd()");
          if (!bVar3) goto LAB_005747c8;
          *puVar4 = 0;
        }
      }
      pBVar5 = LowererMD::InsertMissingItemCompareBranch
                         (&this->m_lowererMD,compareSrc,compareSrc1,opcode,target,insertBeforeInstr)
      ;
      return pBVar5;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    this_00 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
    ;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4661,"(compareSrc->IsInt32() || compareSrc->IsVar())",
                       "compareSrc->IsInt32() || compareSrc->IsVar()");
    if (!bVar3) {
LAB_005747c8:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pBVar5 = InsertCompareBranch((Lowerer *)this_00,compareSrc1,compareSrc,opcode,target,
                               insertBeforeInstr,true);
  return pBVar5;
}

Assistant:

IR::BranchInstr*
Lowerer::InsertMissingItemCompareBranch(IR::Opnd* compareSrc, Js::OpCode opcode, IR::LabelInstr* target, IR::Instr* insertBeforeInstr)
{
    IR::Opnd* missingItemOpnd = GetMissingItemOpndForCompare(compareSrc->GetType(), m_func);
    if (compareSrc->IsFloat64())
    {
        Assert(compareSrc->IsRegOpnd() || compareSrc->IsIndirOpnd());
        return m_lowererMD.InsertMissingItemCompareBranch(compareSrc, missingItemOpnd, opcode, target, insertBeforeInstr);
    }
    else
    {
        Assert(compareSrc->IsInt32() || compareSrc->IsVar());
        return InsertCompareBranch(missingItemOpnd, compareSrc, opcode, target, insertBeforeInstr, true);
    }
}